

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::ChildPopper::popConstrainedChildren
          (Result<wasm::Ok> *__return_storage_ptr__,ChildPopper *this,
          vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
          *children)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  ScopeCtx *pSVar4;
  Constraint *this_00;
  size_t sVar5;
  Type *pTVar6;
  Type right;
  Expression *pEVar7;
  undefined1 extraout_DL;
  size_t i;
  long lVar8;
  size_t sVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  HeapType local_d8 [4];
  undefined1 local_b8 [8];
  Result<wasm::Expression_*> val;
  undefined1 local_78 [8];
  Type type;
  __index_type local_58;
  long local_48;
  long local_40;
  
  val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
  super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ = this;
  pSVar4 = getScope(this->builder);
  if (pSVar4->unreachable != true) {
    bVar10 = false;
LAB_00ce5672:
    uVar12 = ((long)(children->
                    super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(children->
                   super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18 & 0xffffffff;
    while( true ) {
      while( true ) {
        uVar12 = uVar12 - 1;
        uVar11 = (uint)uVar12;
        if ((int)uVar11 < 0) {
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
          return __return_storage_ptr__;
        }
        if (((!bVar10) || (uVar11 == 0)) ||
           ((long)(pSVar4->exprStack).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pSVar4->exprStack).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3 != local_48 + 1)) break;
        pEVar7 = (Expression *)
                 Builder::makeUnreachable
                           ((Builder *)
                            (*(long *)val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>.
                                      _32_8_ + 0x10));
        *(children->
         super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
         )._M_impl.super__Vector_impl_data._M_start[uVar11 & 0x7fffffff].childp = pEVar7;
      }
      sVar9 = Constraint::size(&(children->
                                super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar11 & 0x7fffffff].
                                constraint);
      pop((Result<wasm::Expression_*> *)local_b8,
          (ChildPopper *)
          val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_,sVar9);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)local_78,
                      (_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)local_b8);
      if (local_58 == '\x01') break;
      std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_78);
      ((_Uninitialized<wasm::Expression_*,_true> *)
      (children->
      super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
      )._M_impl.super__Vector_impl_data._M_start[uVar11 & 0x7fffffff].childp)->_M_storage =
           (Expression *)local_b8;
      std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_b8);
    }
    std::__cxx11::string::string((string *)local_d8,(string *)local_78);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_d8);
    std::__cxx11::string::~string((string *)local_d8);
    std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_78);
    std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_b8);
    return __return_storage_ptr__;
  }
  local_40 = ((long)(children->
                    super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(children->
                   super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  lVar8 = (long)(pSVar4->exprStack).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pSVar4->exprStack).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  bVar10 = false;
  this_00 = (Constraint *)0x0;
  sVar9 = 0;
  do {
    if (this_00 == (Constraint *)0x0) {
      if (local_40 == 0) {
        bVar10 = false;
        goto LAB_00ce5672;
      }
      this_00 = (Constraint *)
                Constraint::size(&(children->
                                  super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                                  )._M_impl.super__Vector_impl_data._M_start[local_40 + -1].
                                  constraint);
      local_40 = local_40 + -1;
    }
    this_00 = (Constraint *)
              ((long)&this_00[-1].
                      super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Variant_storage_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
              + 0xf);
    do {
      sVar5 = sVar9;
      if (sVar5 == 0) {
        if (lVar8 == 0) goto LAB_00ce566c;
        lVar1 = lVar8 + -1;
        lVar8 = lVar8 + -1;
        sVar5 = wasm::Type::size(&(pSVar4->exprStack).
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar1]->type);
      }
      pEVar7 = (pSVar4->exprStack).
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8];
      sVar9 = 0;
    } while ((pEVar7->type).id == 0);
    sVar9 = sVar5 - 1;
    pTVar6 = wasm::Type::operator[](&pEVar7->type,sVar9);
    local_78 = (undefined1  [8])pTVar6->id;
    if (!bVar10) goto LAB_00ce5645;
    right.id = (uintptr_t)
               Constraint::operator[]
                         (&(children->
                           super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                           )._M_impl.super__Vector_impl_data._M_start[local_40].constraint,this_00,i
                         );
    switch(extraout_DL) {
    case 0:
      bVar2 = wasm::Type::isSubType((Type)local_78,right);
      if (bVar2) break;
      goto LAB_00ce566c;
    case 1:
      break;
    case 2:
      if ((local_78 != (undefined1  [8])0x1) &&
         ((ulong)local_78 < (Expression *)0x7 || ((ulong)local_78 & 1) != 0)) goto LAB_00ce566c;
      break;
    default:
      handle_unreachable("unexpected constraint",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                         ,0x1f6);
    case 4:
      if (((ulong)local_78 & 1) != 0 || (ulong)local_78 < (Expression *)0x7) goto LAB_00ce55f4;
      local_d8[0] = wasm::Type::getHeapType((Type *)local_78);
      bVar2 = HeapType::isArray(local_d8);
      if (!bVar2) goto LAB_00ce55f4;
      wasm::Type::getHeapType((Type *)local_78);
      HeapType::getArray((HeapType *)local_b8);
      bVar2 = val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
              super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._0_4_ == 1;
      goto LAB_00ce55f7;
    case 5:
      if (((ulong)local_78 & 1) == 0 && (Expression *)0x6 < (ulong)local_78) {
        local_d8[0] = wasm::Type::getHeapType((Type *)local_78);
        bVar2 = HeapType::isArray(local_d8);
        if (bVar2) {
          wasm::Type::getHeapType((Type *)local_78);
          HeapType::getArray((HeapType *)local_b8);
          bVar2 = val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                  super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._0_4_ == 2;
          goto LAB_00ce55f7;
        }
      }
LAB_00ce55f4:
      bVar2 = false;
LAB_00ce55f7:
      if (((ulong)local_78 & 1) == 0 && (Expression *)0x6 < (ulong)local_78) {
        local_b8 = (undefined1  [8])wasm::Type::getHeapType((Type *)local_78);
        bVar3 = HeapType::isMaybeShared((HeapType *)local_b8,none);
      }
      else {
        bVar3 = false;
      }
      if ((!bVar2 && bVar3 == false) && (local_78 != (undefined1  [8])0x1)) {
LAB_00ce566c:
        bVar10 = true;
        goto LAB_00ce5672;
      }
    }
LAB_00ce5645:
    if (local_78 == (undefined1  [8])0x1) {
      local_48 = lVar8;
    }
    bVar10 = (bool)(bVar10 | local_78 == (undefined1  [8])0x1);
  } while( true );
}

Assistant:

Result<> popConstrainedChildren(std::vector<Child>& children) {
    auto& scope = builder.getScope();

    // Two-part indices into the stack of available expressions and the vector
    // of requirements, allowing them to move independently with the granularity
    // of a single tuple element.
    size_t stackIndex = scope.exprStack.size();
    size_t stackTupleIndex = 0;
    size_t childIndex = children.size();
    size_t childTupleIndex = 0;

    // The index of the shallowest unreachable instruction on the stack.
    std::optional<size_t> unreachableIndex;

    // Whether popping the children past the unreachable would produce a type
    // mismatch or try to pop from an empty stack.
    bool needUnreachableFallback = false;

    if (!scope.unreachable) {
      // We only need to check requirements if there is an unreachable.
      // Otherwise the validator will catch any problems.
      goto pop;
    }

    // Check whether the values on the stack will be able to meet the given
    // requirements.
    while (true) {
      // Advance to the next requirement.
      if (childTupleIndex > 0) {
        --childTupleIndex;
      } else {
        if (childIndex == 0) {
          // We have examined all the requirements.
          break;
        }
        --childIndex;
        childTupleIndex = children[childIndex].constraint.size() - 1;
      }

      // Advance to the next available value on the stack.
      while (true) {
        if (stackTupleIndex > 0) {
          --stackTupleIndex;
        } else {
          if (stackIndex == 0) {
            // No more available values. This is valid iff we are reaching past
            // an unreachable, but we still need the fallback behavior to ensure
            // the input unreachable instruction is executed first. If we are
            // not reaching past an unreachable, the error will be caught when
            // we pop.
            needUnreachableFallback = true;
            goto pop;
          }
          --stackIndex;
          stackTupleIndex = scope.exprStack[stackIndex]->type.size() - 1;
        }

        // Skip expressions that don't produce values.
        if (scope.exprStack[stackIndex]->type == Type::none) {
          stackTupleIndex = 0;
          continue;
        }
        break;
      }

      // We have an available type and a constraint. Only check constraints if
      // we are past an unreachable, since otherwise we can leave problems to be
      // caught by the validator later.
      auto type = scope.exprStack[stackIndex]->type[stackTupleIndex];
      if (unreachableIndex) {
        auto constraint = children[childIndex].constraint[childTupleIndex];
        if (constraint.isAnyType()) {
          // Always succeeds.
        } else if (constraint.isAnyReference()) {
          if (!type.isRef() && type != Type::unreachable) {
            needUnreachableFallback = true;
            break;
          }
        } else if (auto bound = constraint.getSubtype()) {
          if (!Type::isSubType(type, *bound)) {
            needUnreachableFallback = true;
            break;
          }
        } else if (constraint.isAnyI8ArrayReference()) {
          bool isI8Array =
            type.isRef() && type.getHeapType().isArray() &&
            type.getHeapType().getArray().element.packedType == Field::i8;
          bool isNone =
            type.isRef() && type.getHeapType().isMaybeShared(HeapType::none);
          if (!isI8Array && !isNone && type != Type::unreachable) {
            needUnreachableFallback = true;
            break;
          }
        } else if (constraint.isAnyI16ArrayReference()) {
          bool isI16Array =
            type.isRef() && type.getHeapType().isArray() &&
            type.getHeapType().getArray().element.packedType == Field::i16;
          bool isNone =
            type.isRef() && type.getHeapType().isMaybeShared(HeapType::none);
          if (!isI16Array && !isNone && type != Type::unreachable) {
            needUnreachableFallback = true;
            break;
          }
        } else {
          WASM_UNREACHABLE("unexpected constraint");
        }
      }

      // No problems for children after this unreachable.
      if (type == Type::unreachable) {
        assert(!needUnreachableFallback);
        unreachableIndex = stackIndex;
      }
    }

  pop:
    // We have checked all the constraints, so we are ready to pop children.
    for (int i = children.size() - 1; i >= 0; --i) {
      if (needUnreachableFallback &&
          scope.exprStack.size() == *unreachableIndex + 1 && i > 0) {
        // The next item on the stack is the unreachable instruction we must
        // not pop past. We cannot insert unreachables in front of it because
        // it might be a branch we actually have to execute, so this next item
        // must be child 0. But we are not ready to pop child 0 yet, so
        // synthesize an unreachable instead of popping. The deeper
        // instructions that would otherwise have been popped will remain on
        // the stack to become prior children of future expressions or to be
        // implicitly dropped at the end of the scope.
        *children[i].childp = builder.builder.makeUnreachable();
        continue;
      }

      // Pop a child normally.
      auto val = pop(children[i].constraint.size());
      CHECK_ERR(val);
      *children[i].childp = *val;
    }
    return Ok{};
  }